

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O3

EncodeParams *
cinemo::threading::divideWork
          (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,long numThreads
          )

{
  undefined8 *puVar1;
  iterator __position;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  pointer ppLVar6;
  int iVar7;
  long lVar8;
  pointer ppLVar9;
  long lVar10;
  vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *this;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = numThreads;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar3 = uVar4;
  }
  plVar5 = (long *)operator_new__(uVar3);
  *plVar5 = numThreads;
  if (numThreads != 0) {
    lVar8 = 0;
    do {
      *(undefined2 *)((long)plVar5 + lVar8 + 0xc) = 0;
      *(undefined1 *)((long)plVar5 + lVar8 + 0xe) = 0;
      *(undefined4 *)((long)plVar5 + lVar8 + 0x10) = 3;
      puVar1 = (undefined8 *)((long)plVar5 + lVar8 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)plVar5 + lVar8 + 0x28) = 0;
      lVar8 = lVar8 + 0x28;
    } while (numThreads * 0x28 != lVar8);
  }
  ppLVar9 = (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar6 = (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar6 != ppLVar9) {
    iVar7 = 0;
    do {
      if (0 < numThreads) {
        uVar3 = (ulong)iVar7;
        lVar8 = uVar3 * 8;
        lVar10 = 0;
        this = (vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>> *)(plVar5 + 3);
        do {
          ppLVar9 = (lw->
                    super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppLVar6 = (lw->
                    super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)((long)ppLVar6 - (long)ppLVar9 >> 3) <= uVar3) {
            iVar7 = iVar7 - (int)lVar10;
            goto LAB_001086f3;
          }
          __position._M_current = *(LameWrapper ***)(this + 8);
          if (__position._M_current == *(LameWrapper ***)(this + 0x10)) {
            std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>::
            _M_realloc_insert<cinemo::LameWrapper*const&>
                      (this,__position,(LameWrapper **)((long)ppLVar9 + lVar8));
          }
          else {
            *__position._M_current = *(LameWrapper **)((long)ppLVar9 + lVar8);
            *(long *)(this + 8) = *(long *)(this + 8) + 8;
          }
          lVar10 = lVar10 + -1;
          lVar8 = lVar8 + 8;
          this = this + 0x28;
          uVar3 = uVar3 + 1;
        } while (-lVar10 != numThreads);
        ppLVar9 = (lw->
                  super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        ppLVar6 = (lw->
                  super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar7 = iVar7 + (int)numThreads;
      }
LAB_001086f3:
    } while ((ulong)(long)iVar7 < (ulong)((long)ppLVar6 - (long)ppLVar9 >> 3));
  }
  return (EncodeParams *)(plVar5 + 1);
}

Assistant:

static EncodeParams* divideWork(const vector<LameWrapper*>& lw,
                                      long numThreads) {
            EncodeParams* wp = new EncodeParams[numThreads];
            int ja = 0; //Jobs Assigned

            while (ja < lw.size()) {
                for (int i = 0; i < numThreads && ja < lw.size(); ++i) {
                    wp[i].works.push_back(lw[ja++]);
                }
            }

            return wp;
        }